

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

Rect __thiscall lunasvg::SVGLineElement::updateShape(SVGLineElement *this,Path *path)

{
  float x;
  float y;
  float x_00;
  float y_00;
  float y2;
  float x2;
  float y1;
  float x1;
  LengthContext lengthContext;
  Path *path_local;
  SVGLineElement *this_local;
  
  lengthContext._8_8_ = path;
  LengthContext::LengthContext((LengthContext *)&y1,(SVGElement *)this,UserSpaceOnUse);
  x = LengthContext::valueForLength((LengthContext *)&y1,&this->m_x1);
  y = LengthContext::valueForLength((LengthContext *)&y1,&this->m_y1);
  x_00 = LengthContext::valueForLength((LengthContext *)&y1,&this->m_x2);
  y_00 = LengthContext::valueForLength((LengthContext *)&y1,&this->m_y2);
  Path::moveTo((Path *)lengthContext._8_8_,x,y);
  Path::lineTo((Path *)lengthContext._8_8_,x_00,y_00);
  Rect::Rect((Rect *)&this_local,x,y,x_00 - x,y_00 - y);
  return _this_local;
}

Assistant:

Rect SVGLineElement::updateShape(Path& path)
{
    LengthContext lengthContext(this);
    auto x1 = lengthContext.valueForLength(m_x1);
    auto y1 = lengthContext.valueForLength(m_y1);
    auto x2 = lengthContext.valueForLength(m_x2);
    auto y2 = lengthContext.valueForLength(m_y2);

    path.moveTo(x1, y1);
    path.lineTo(x2, y2);
    return Rect(x1, y1, x2 - x1, y2 - y1);
}